

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
detail::writer::operator()(writer *this,optional_field<example::exercise_t,_0UL> *val)

{
  value_type *pvVar1;
  size_t sVar2;
  undefined8 uVar3;
  
  pvVar1 = this->optv_;
  if (pvVar1 != (value_type *)0x0) {
    if ((val->super_optional<example::exercise_t>).super_type.m_initialized == true) {
      (this->opts_).super__Base_bitset<1UL>._M_w = 0xffff;
      *pvVar1 = 0xffff;
      if ((this->buf_).size_ == 0) {
        sVar2 = 0;
      }
      else {
        *(exercise_t *)(this->buf_).data_ =
             (val->super_optional<example::exercise_t>).super_type.m_storage;
        sVar2 = (this->buf_).size_;
      }
      (this->buf_).data_ = (void *)((long)(this->buf_).data_ + (ulong)(sVar2 != 0));
      (this->buf_).size_ = sVar2 - (sVar2 != 0);
    }
    return;
  }
  uVar3 = __cxa_allocate_exception(0x40);
  bad_message();
  __cxa_throw(uVar3,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

void operator()(example::optional_field<T, N> const& val) const {
        if (!optv_)
            throw bad_message();
        if (val) {
            opts_.set();
            *optv_ = static_cast<example::opt_fields::value_type>(opts_.to_ulong());
            (*this)(*val);
        }
    }